

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

void linebreak_check_after_write
               (int *cols_used,size_t *wrt,char *last_sep,char **buffer,size_t *bs,size_t inc,
               int *args_written_this_line,int linelength)

{
  long *in_RCX;
  undefined1 *in_RDX;
  long *in_RSI;
  int *in_RDI;
  long *in_R8;
  long in_R9;
  
  *(int *)inc = *(int *)inc + 1;
  if (((int)bs < *in_RDI) && (1 < *(int *)inc)) {
    *in_RDX = 10;
    memmove(in_RDX + 5,in_RDX + 1,in_R9 + 1);
    in_RDX[4] = 0x20;
    in_RDX[3] = 0x20;
    in_RDX[2] = 0x20;
    in_RDX[1] = 0x20;
    *in_RDI = (int)in_R9 + 4;
    *in_RSI = *in_RSI + 4;
    *in_RCX = *in_RCX + 4;
    *in_R8 = *in_R8 + -4;
    *(undefined4 *)inc = 1;
  }
  return;
}

Assistant:

static void linebreak_check_after_write(int* cols_used, size_t* wrt,
                                        char* last_sep,
                                        char** buffer, size_t* bs,
                                        size_t inc, int* args_written_this_line,
                                        int linelength)
{

    ++*args_written_this_line;
    // did we break the line length,
    // and this was not the first arg written in this line?
    if(*cols_used > linelength && (*args_written_this_line > 1))
    {
        // insert "\n    "
        *last_sep = '\n';
        assert(*bs >= 4);
        memmove(last_sep+5, last_sep+1, 1+inc);
        last_sep[1] = last_sep[2] = last_sep[3] = last_sep[4] = ' ';
        *cols_used = 4 + inc;
        *wrt += 4;
        *buffer += 4;
        *bs -= 4;
        *args_written_this_line = 1;
    }
}